

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

LPSTR MapFileOpenModes(LPSTR str,BOOL *bTextMode)

{
  char *pcVar1;
  size_t sVar2;
  BOOL *pBVar3;
  char *local_30;
  LPSTR temp;
  LPSTR retval;
  BOOL *bTextMode_local;
  LPSTR str_local;
  
  if (bTextMode == (BOOL *)0x0) {
    fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x59);
    fprintf(_stderr,"MapFileOpenModes called with a NULL parameter for bTextMode.\n");
    str_local = (LPSTR)0x0;
  }
  else {
    *bTextMode = 1;
    if (str == (LPSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x61);
      fprintf(_stderr,"MapFileOpenModes called with a NULL parameter for str.\n");
      str_local = (LPSTR)0x0;
    }
    else {
      pcVar1 = strchr(str,0x44);
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strchr(str,0x62);
        if (pcVar1 != (char *)0x0) {
          *bTextMode = 0;
        }
        sVar2 = strlen(str);
        str_local = (LPSTR)PAL_malloc(sVar2 + 1);
        pcVar1 = str_local;
        pBVar3 = (BOOL *)str;
        if (str_local == (char *)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          str_local = (LPSTR)0x0;
        }
        else {
          while (bTextMode_local = pBVar3, local_30 = pcVar1, (char)*bTextMode_local != '\0') {
            if ((((char)*bTextMode_local == 'r') || ((char)*bTextMode_local == 'w')) ||
               ((char)*bTextMode_local == 'a')) {
              *local_30 = (char)*bTextMode_local;
              pcVar1 = local_30 + 1;
              pBVar3 = (BOOL *)((long)bTextMode_local + 1);
              if ((pBVar3 != (BOOL *)0x0) && (*(char *)pBVar3 == '+')) {
                *pcVar1 = *(char *)pBVar3;
                pcVar1 = local_30 + 2;
                pBVar3 = (BOOL *)((long)bTextMode_local + 2);
              }
            }
            else {
              pcVar1 = local_30;
              pBVar3 = (BOOL *)((long)bTextMode_local + 1);
            }
          }
          *local_30 = '\0';
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
                ,0x7d);
        fprintf(_stderr,"The PAL doesn\'t support the \'D\' flag for _fdopen and fopen.\n");
        str_local = (LPSTR)0x0;
      }
    }
  }
  return str_local;
}

Assistant:

static LPSTR MapFileOpenModes(LPSTR str , BOOL * bTextMode)
{
    LPSTR retval = NULL;
    LPSTR temp = NULL;

    if (NULL == bTextMode)
    {
        ASSERT("MapFileOpenModes called with a NULL parameter for bTextMode.\n");
        return NULL;
    }

    *bTextMode = TRUE;

    if (NULL == str)
    {
        ASSERT("MapFileOpenModes called with a NULL parameter for str.\n");
        return NULL;
    }

    /* The PAL behaves differently for some Windows file open modes:

    c, n, S, R, and T: these are all hints to the system that aren't supported
    by the PAL. Since the user cannot depend on this behavior, it's safe to
    simply ignore these modes.

    D: specifies a file as temporary. This file is expected to be deleted when
    the last file descriptor is closed. The PAL does not support this behavior
    and asserts when this mode is used.

    t: represents opening in text mode. Calls to fdopen on Unix don't accept
    't' so it is silently stripped out. However, the PAL supports the mode by
    having the PAL wrappers do the translation of CR-LF to LF and vice versa.

    t vs. b: To get binary mode, you must explicitly use 'b'. If neither mode
    is specified on Windows, the default mode is defined by the global
    variable _fmode. The PAL simply defaults to text mode. After examining
    CLR usage patterns, the PAL behavior seems acceptable. */

    /* Check if the mode specifies deleting the temporary file
    automatically when the last file descriptor is closed.
    The PAL does not support this behavior. */
    if (NULL != strchr(str,'D'))
    {
        ASSERT("The PAL doesn't support the 'D' flag for _fdopen and fopen.\n");
        return NULL;
    }

    /* Check if the mode specifies opening in binary.
    If so, set the bTextMode to false. */
    if(NULL != strchr(str,'b'))
    {
        *bTextMode = FALSE;
    }

    retval = (LPSTR)PAL_malloc( ( strlen( str ) + 1 ) * sizeof( CHAR ) );
    if (NULL == retval)
    {
        ERROR("Unable to allocate memory.\n");
        return NULL;
    }

    temp = retval;
    while ( *str )
    {
        if ( *str == 'r' || *str == 'w' || *str == 'a' )
        {
            *temp = *str;
            temp++;
            if ( ( ++str != NULL ) && *str == '+' )
            {
                *temp = *str;
                temp++;
                str++;
            }
        }
        else
        {
            str++;
        }
    }
    *temp = '\0';
    return retval;
}